

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O3

void * Intp_ManUnsatCore(Intp_Man_t *p,Sto_Man_t *pCnf,int fLearned,int fVerbose)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  FILE *pFVar7;
  void *pvVar8;
  void **ppvVar9;
  Vec_Int_t *vCore;
  int *piVar10;
  Vec_Str_t *vVisited;
  char *__s;
  Sto_Man_t *pSVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  Sto_Cls_t *pSVar16;
  timespec ts;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3cc,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  p->pCnf = pCnf;
  p->fVerbose = fVerbose;
  Intp_ManResize(p);
  if (p->fProofWrite != 0) {
    pFVar7 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar7;
    p->Counter = 0;
  }
  p->vAntClas->nSize = 0;
  p->nAntStart = p->pCnf->nRoots;
  for (pSVar16 = p->pCnf->pHead; (pSVar16 != (Sto_Cls_t *)0x0 && ((pSVar16->field_0x1c & 2) != 0));
      pSVar16 = pSVar16->pNext) {
    Intp_ManProofWriteOne(p,pSVar16);
  }
  iVar5 = Intp_ManProcessRoots(p);
  pSVar11 = p->pCnf;
  if ((iVar5 != 0) && (pSVar16 = pSVar11->pHead, pSVar16 != (Sto_Cls_t *)0x0)) {
    do {
      if ((pSVar16->field_0x1c & 2) == 0) {
        iVar5 = Intp_ManProofRecordOne(p,pSVar16);
        if (iVar5 == 0) break;
      }
      pSVar16 = pSVar16->pNext;
    } while (pSVar16 != (Sto_Cls_t *)0x0);
    pSVar11 = p->pCnf;
  }
  pVVar4 = p->vAntClas;
  uVar1 = pVVar4->nSize;
  if (pSVar11->pEmpty->Id - p->nAntStart == uVar1 - 1) {
    pvVar8 = calloc(1,0x10);
    if (uVar1 == pVVar4->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc(0x80);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
        }
        pVVar4->pArray = ppvVar9;
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (void **)0x0) {
          ppvVar9 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
        }
        pVVar4->pArray = ppvVar9;
        pVVar4->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar9 = pVVar4->pArray;
    }
    iVar5 = pVVar4->nSize;
    pVVar4->nSize = iVar5 + 1;
    ppvVar9[iVar5] = pvVar8;
    if (p->fProofWrite != 0) {
      fclose((FILE *)p->pFile);
      p->pFile = (FILE *)0x0;
    }
    if (fVerbose != 0) {
      pSVar11 = p->pCnf;
      uVar1 = pSVar11->nVars;
      uVar2 = pSVar11->nRoots;
      uVar3 = p->Counter;
      uVar14 = pSVar11->nClauses - uVar2;
      iVar5 = Sto_ManMemoryReport(pSVar11);
      printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n",
             (double)(int)(uVar3 - uVar2) / (double)(int)uVar14,(double)iVar5 * 9.5367431640625e-07,
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar14,(ulong)uVar3);
      iVar5 = clock_gettime(3,&local_40);
      if (iVar5 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      p->timeTotal = p->timeTotal + lVar13 + lVar12;
    }
    vCore = (Vec_Int_t *)malloc(0x10);
    vCore->nCap = 1000;
    vCore->nSize = 0;
    piVar10 = (int *)malloc(4000);
    vCore->pArray = piVar10;
    pSVar11 = p->pCnf;
    iVar5 = pSVar11->pEmpty->Id;
    __n = (long)iVar5 + 1;
    vVisited = (Vec_Str_t *)malloc(0x10);
    iVar15 = (int)__n;
    iVar6 = 0x10;
    if (0xe < (ulong)(long)iVar5) {
      iVar6 = iVar15;
    }
    vVisited->nCap = iVar6;
    if (iVar6 == 0) {
      __s = (char *)0x0;
    }
    else {
      __s = (char *)malloc((long)iVar6);
    }
    vVisited->pArray = __s;
    vVisited->nSize = iVar15;
    memset(__s,0,__n);
    Intp_ManUnsatCore_rec(p->vAntClas,iVar5,vCore,pSVar11->nRoots,vVisited,fLearned);
    if (__s != (char *)0x0) {
      free(__s);
    }
    free(vVisited);
    if (fVerbose != 0) {
      uVar1 = p->pCnf->nRoots;
      printf("Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n",(ulong)uVar1,
             (ulong)(p->pCnf->nClauses - uVar1),(ulong)(uint)vCore->nSize);
    }
    return vCore;
  }
  __assert_fail("p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                ,0x3f7,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
}

Assistant:

void * Intp_ManUnsatCore( Intp_Man_t * p, Sto_Man_t * pCnf, int fLearned, int fVerbose )
{
    Vec_Int_t * vCore;
    Vec_Str_t * vVisited;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;

    // adjust the manager
    Intp_ManResize( p ); 

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
//    Vec_IntClear( p->vAnties );
//    Vec_IntFill( p->vBreaks, p->pCnf->nRoots, 0 );
    Vec_PtrClear( p->vAntClas );
    p->nAntStart = p->pCnf->nRoots;

    Sto_ManForEachClauseRoot( p->pCnf, pClause )
        Intp_ManProofWriteOne( p, pClause );

    // propagate root level assignments
    if ( Intp_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Intp_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
        }
    }

    // add the last breaker
//    assert( p->pCnf->pEmpty->Id == Vec_IntSize(p->vBreaks) - 1 );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
    assert( p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1 );
    Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );

    // stop the proof
    if ( p->fProofWrite )
    {
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Core", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    // derive the UNSAT core
    vCore = Vec_IntAlloc( 1000 );
    vVisited = Vec_StrStart( p->pCnf->pEmpty->Id+1 );
    Intp_ManUnsatCore_rec( p->vAntClas, p->pCnf->pEmpty->Id, vCore, p->pCnf->nRoots, vVisited, fLearned );
    Vec_StrFree( vVisited );
    if ( fVerbose )
        printf( "Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n", 
            p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, Vec_IntSize(vCore) );
//    Intp_ManUnsatCoreVerify( p->pCnf, vCore );
    return vCore;   
}